

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O2

Clump * rw::Clump::streamRead(Stream *stream)

{
  LLLink *pLVar1;
  FILE *pFVar2;
  uint32 uVar3;
  bool bVar4;
  int32 iVar5;
  int32 iVar6;
  Clump *this;
  FrameList_ *pFVar7;
  undefined4 extraout_var;
  Geometry **geometryList;
  Geometry *pGVar8;
  Atomic *pAVar9;
  Light *this_00;
  Camera *this_01;
  undefined8 uVar10;
  ulong uVar11;
  size_t __n;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  Error _e_1;
  uint32 version;
  ulong local_60;
  FrameList_ frmlst;
  uint32 length;
  int32 buf [3];
  
  bVar4 = findChunk(stream,1,&length,&version);
  if (!bVar4) {
    frmlst.numFrames = 2;
    frmlst._4_4_ = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0x9d);
    pFVar2 = _stderr;
    pcVar12 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar2,"%s\n",pcVar12);
    setError((Error *)&frmlst);
    return (Clump *)0x0;
  }
  Stream::read32(stream,buf,length);
  uVar3 = version;
  this = create();
  if (this == (Clump *)0x0) {
    return (Clump *)0x0;
  }
  frmlst.frames = (Frame **)0x0;
  bVar4 = findChunk(stream,0xe,(uint32 *)0x0,(uint32 *)0x0);
  if (!bVar4) {
    _e_1.plugin = 2;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xb0);
    pcVar12 = "FRAMELIST";
    goto LAB_001292ba;
  }
  pFVar7 = FrameList_::streamRead(&frmlst,stream);
  if (pFVar7 == (FrameList_ *)0x0) goto LAB_00128f8a;
  (this->object).parent = *frmlst.frames;
  if (version < 0x30400) {
    geometryList = (Geometry **)0x0;
    local_60 = 0;
LAB_00128fb9:
    iVar14 = buf[0];
    if (buf[0] < 1) {
      iVar14 = 0;
    }
    while (bVar4 = iVar14 != 0, iVar14 = iVar14 + -1, bVar4) {
      bVar4 = findChunk(stream,0x14,(uint32 *)0x0,(uint32 *)0x0);
      if (!bVar4) {
        _e_1.plugin = 2;
        _e_1.code = 0x80000004;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xdc);
        pcVar12 = "ATOMIC";
        goto LAB_0012948f;
      }
      pAVar9 = Atomic::streamReadClump(stream,&frmlst,geometryList);
      if (pAVar9 == (Atomic *)0x0) goto LAB_00128f57;
      pAVar9->clump = this;
      (pAVar9->inClump).next = &(this->atomics).link;
      pLVar1 = (this->atomics).link.prev;
      (pAVar9->inClump).prev = pLVar1;
      pLVar1->next = &pAVar9->inClump;
      (this->atomics).link.prev = &pAVar9->inClump;
    }
    if (0x33000 < uVar3) {
      iVar5 = buf[1];
      if (buf[1] < 1) {
        iVar5 = 0;
      }
      while (bVar4 = iVar5 != 0, iVar5 = iVar5 + -1, bVar4) {
        bVar4 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar4) {
          uVar10 = 0xea;
          goto LAB_00129410;
        }
        iVar6 = Stream::readI32(stream);
        bVar4 = findChunk(stream,0x12,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar4) {
          _e_1.plugin = 2;
          _e_1.code = 0x80000004;
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xef
                 );
          pcVar12 = "LIGHT";
          goto LAB_0012948f;
        }
        this_00 = Light::streamRead(stream);
        if (this_00 == (Light *)0x0) goto LAB_00128f57;
        ObjectWithFrame::setFrame(&this_00->object,frmlst.frames[iVar6]);
        this_00->clump = this;
        (this_00->inClump).next = &(this->lights).link;
        pLVar1 = (this->lights).link.prev;
        (this_00->inClump).prev = pLVar1;
        pLVar1->next = &this_00->inClump;
        (this->lights).link.prev = &this_00->inClump;
      }
      if (0x33000 < uVar3) {
        iVar5 = buf[2];
        if (buf[2] < 1) {
          iVar5 = 0;
        }
LAB_0012913e:
        bVar4 = iVar5 != 0;
        iVar5 = iVar5 + -1;
        if (bVar4) {
          bVar4 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
          if (bVar4) {
            iVar6 = Stream::readI32(stream);
            bVar4 = findChunk(stream,5,(uint32 *)0x0,(uint32 *)0x0);
            if (!bVar4) {
              _e_1.plugin = 2;
              _e_1.code = 0x80000004;
              fprintf(_stderr,"%s:%d: ",
                      "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",
                      0x102);
              pcVar12 = "CAMERA";
LAB_0012948f:
              pFVar2 = _stderr;
              pcVar12 = dbgsprint(0x80000004,pcVar12);
              fprintf(pFVar2,"%s\n",pcVar12);
              setError(&_e_1);
              goto LAB_00128f57;
            }
            this_01 = Camera::streamRead(stream);
            if (this_01 != (Camera *)0x0) goto code_r0x00129190;
          }
          else {
            uVar10 = 0xfd;
LAB_00129410:
            _e_1.plugin = 2;
            _e_1.code = 0x80000004;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",
                    uVar10);
            pFVar2 = _stderr;
            pcVar12 = dbgsprint(0x80000004,"STRUCT");
            fprintf(pFVar2,"%s\n",pcVar12);
            setError(&_e_1);
          }
          goto LAB_00128f57;
        }
      }
    }
    uVar13 = 0;
    uVar11 = 0;
    if (0 < (int)local_60) {
      uVar11 = local_60 & 0xffffffff;
    }
    for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      if (geometryList[uVar13] != (Geometry *)0x0) {
        Geometry::destroy(geometryList[uVar13]);
      }
    }
    (*DAT_00143840)(geometryList);
    (*DAT_00143840)(frmlst.frames);
    bVar4 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
    if (bVar4) {
      return this;
    }
LAB_00128f57:
    uVar11 = 0;
    uVar13 = local_60 & 0xffffffff;
    if ((int)local_60 < 1) {
      uVar13 = uVar11;
    }
    for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      if (geometryList[uVar11] != (Geometry *)0x0) {
        Geometry::destroy(geometryList[uVar11]);
      }
    }
    (*DAT_00143840)(geometryList);
  }
  else {
    bVar4 = findChunk(stream,0x1a,(uint32 *)0x0,(uint32 *)0x0);
    if (bVar4) {
      bVar4 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
      if (bVar4) {
        iVar5 = Stream::readI32(stream);
        local_60 = CONCAT44(extraout_var,iVar5);
        uVar13 = 0;
        if (iVar5 == 0) {
          geometryList = (Geometry **)0x0;
        }
        else {
          __n = (long)iVar5 << 3;
          allocLocation =
               "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp line: 198"
          ;
          geometryList = (Geometry **)(*Engine::memfuncs)(__n);
          if (geometryList == (Geometry **)0x0) {
            _e_1.plugin = 2;
            _e_1.code = 0x80000002;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",
                    200);
            pFVar2 = _stderr;
            pcVar12 = dbgsprint(0x80000002,__n);
            fprintf(pFVar2,"%s\n",pcVar12);
            setError(&_e_1);
            goto LAB_00128f8a;
          }
          memset(geometryList,0,__n);
        }
        uVar11 = local_60 & 0xffffffff;
        if ((int)local_60 < 1) {
          uVar11 = uVar13;
        }
        do {
          if (uVar11 == uVar13) goto LAB_00128fb9;
          bVar4 = findChunk(stream,0xf,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar4) {
            _e_1.plugin = 2;
            _e_1.code = 0x80000004;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",
                    0xcf);
            pcVar12 = "GEOMETRY";
            goto LAB_0012948f;
          }
          pGVar8 = Geometry::streamRead(stream);
          geometryList[uVar13] = pGVar8;
          uVar13 = uVar13 + 1;
        } while (pGVar8 != (Geometry *)0x0);
        goto LAB_00128f57;
      }
      _e_1.plugin = 2;
      _e_1.code = 0x80000004;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xc0);
      pcVar12 = "STRUCT";
    }
    else {
      _e_1.plugin = 2;
      _e_1.code = 0x80000004;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp",0xbc);
      pcVar12 = "GEOMETRYLIST";
    }
LAB_001292ba:
    pFVar2 = _stderr;
    pcVar12 = dbgsprint(0x80000004,pcVar12);
    fprintf(pFVar2,"%s\n",pcVar12);
    setError(&_e_1);
  }
LAB_00128f8a:
  (*DAT_00143840)(frmlst.frames);
  destroy(this);
  return (Clump *)0x0;
code_r0x00129190:
  ObjectWithFrame::setFrame(&this_01->object,frmlst.frames[iVar6]);
  this_01->clump = this;
  (this_01->inClump).next = &(this->cameras).link;
  pLVar1 = (this->cameras).link.prev;
  (this_01->inClump).prev = pLVar1;
  pLVar1->next = &this_01->inClump;
  (this->cameras).link.prev = &this_01->inClump;
  goto LAB_0012913e;
}

Assistant:

Clump*
Clump::streamRead(Stream *stream)
{
	uint32 length, version;
	int32 buf[3];
	Clump *clump;
	int32 numGeometries;
	Geometry **geometryList;

	if(!findChunk(stream, ID_STRUCT, &length, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(buf, length);
	int32 numAtomics = buf[0];
	int32 numLights = 0;
	int32 numCameras = 0;
	if(version > 0x33000){
		numLights = buf[1];
		numCameras = buf[2];
	}
	clump = Clump::create();
	if(clump == nil)
		return nil;

	// Frame list
	FrameList_ frmlst;
	frmlst.frames = nil;
	if(!findChunk(stream, ID_FRAMELIST, nil, nil)){
		RWERROR((ERR_CHUNK, "FRAMELIST"));
		goto fail;
	}
	if(frmlst.streamRead(stream) == nil)
		goto fail;
	clump->setFrame(frmlst.frames[0]);

	// Geometry list
	numGeometries = 0;
	geometryList = nil;
	if(version >= 0x30400){
		if(!findChunk(stream, ID_GEOMETRYLIST, nil, nil)){
			RWERROR((ERR_CHUNK, "GEOMETRYLIST"));
			goto fail;
		}
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto fail;
		}
		numGeometries = stream->readI32();
		if(numGeometries){
			size_t sz = numGeometries*sizeof(Geometry*);
			geometryList = (Geometry**)rwMalloc(sz, MEMDUR_FUNCTION | ID_CLUMP);
			if(geometryList == nil){
				RWERROR((ERR_ALLOC, sz));
				goto fail;
			}
			memset(geometryList, 0, sz);
		}
		for(int32 i = 0; i < numGeometries; i++){
			if(!findChunk(stream, ID_GEOMETRY, nil, nil)){
				RWERROR((ERR_CHUNK, "GEOMETRY"));
				goto failgeo;
			}
			geometryList[i] = Geometry::streamRead(stream);
			if(geometryList[i] == nil)
				goto failgeo;
		}
	}

	// Atomics
	Atomic *a;
	for(int32 i = 0; i < numAtomics; i++){
		if(!findChunk(stream, ID_ATOMIC, nil, nil)){
			RWERROR((ERR_CHUNK, "ATOMIC"));
			goto failgeo;
		}
		a = Atomic::streamReadClump(stream, &frmlst, geometryList);
		if(a == nil)
			goto failgeo;
		clump->addAtomic(a);
	}

	// Lights
	int32 frm;
	Light *l;
	for(int32 i = 0; i < numLights; i++){
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto failgeo;
		}
		frm = stream->readI32();
		if(!findChunk(stream, ID_LIGHT, nil, nil)){
			RWERROR((ERR_CHUNK, "LIGHT"));
			goto failgeo;
		}
		l = Light::streamRead(stream);
		if(l == nil)
			goto failgeo;
		l->setFrame(frmlst.frames[frm]);
		clump->addLight(l);
	}

	// Cameras
	Camera *cam;
	for(int32 i = 0; i < numCameras; i++){
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto failgeo;
		}
		frm = stream->readI32();
		if(!findChunk(stream, ID_CAMERA, nil, nil)){
			RWERROR((ERR_CHUNK, "CAMERA"));
			goto failgeo;
		}
		cam = Camera::streamRead(stream);
		if(cam == nil)
			goto failgeo;
		cam->setFrame(frmlst.frames[frm]);
		clump->addCamera(cam);
	}

	for(int32 i = 0; i < numGeometries; i++)
		if(geometryList[i])
			geometryList[i]->destroy();
	rwFree(geometryList);
	rwFree(frmlst.frames);
	if(s_plglist.streamRead(stream, clump))
		return clump;

failgeo:
	for(int32 i = 0; i < numGeometries; i++)
		if(geometryList[i])
			geometryList[i]->destroy();
	rwFree(geometryList);
fail:
	rwFree(frmlst.frames);
	clump->destroy();
	return nil;
}